

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLABecLaplacian::Fsmooth
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs,int redblack)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pIVar8;
  FabArray<amrex::IArrayBox> *this_00;
  uint uVar9;
  MLABecLaplacian *pMVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  undefined8 *puVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int *piVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  undefined4 in_register_0000008c;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  int *piVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  double dVar68;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double local_f38;
  double local_f30;
  long local_f28;
  long local_f20;
  long local_f18;
  long local_f10;
  long local_f08;
  long local_ef8;
  double *local_ef0;
  double *local_ee8;
  long local_ee0;
  long local_ed0;
  long local_ec8;
  int *local_ec0;
  long local_e98;
  long local_e90;
  long local_e78;
  int *local_e38;
  int *local_e30;
  long local_de0;
  double *local_db8;
  double local_d68;
  double dStack_d60;
  long local_d40;
  Array4<double> local_d18;
  long local_cd8;
  int *local_cd0;
  undefined8 local_cc8;
  long local_cc0;
  long local_cb8;
  double *local_cb0;
  double *local_ca8;
  int *local_ca0;
  double *local_c98;
  Real local_c90;
  Box local_c84;
  MLABecLaplacian *local_c68;
  int *local_c60;
  long local_c58;
  ulong local_c50;
  double *local_c48;
  Array4<const_double> local_c40;
  Array4<const_double> local_c00;
  Array4<const_double> local_bc0;
  Array4<const_double> local_b80;
  Array4<const_double> local_b40;
  Array4<const_double> local_b00;
  Array4<const_double> local_ac0;
  Array4<const_double> local_a80;
  Array4<const_double> local_a40;
  Array4<const_double> local_a00;
  long local_9c0;
  ulong local_9b8;
  long local_9b0;
  double *local_9a8;
  double *local_9a0;
  int local_998;
  uint local_994;
  int local_990;
  int local_98c;
  Array4<const_double> local_988;
  Array4<const_int> local_948;
  Array4<const_int> local_908;
  Array4<const_int> local_8c8;
  Array4<const_int> local_888;
  Array4<const_int> local_848;
  Array4<const_int> local_808;
  Box local_7c4;
  long local_7a8;
  long local_7a0;
  FabArray<amrex::FArrayBox> *local_798;
  ulong local_790;
  FabArray<amrex::Mask> *local_788;
  FabArray<amrex::Mask> *local_780;
  FabArray<amrex::Mask> *local_778;
  FabArray<amrex::FArrayBox> *local_770;
  FabArray<amrex::FArrayBox> *local_768;
  FabArray<amrex::FArrayBox> *local_760;
  FabArray<amrex::FArrayBox> *local_758;
  FabArray<amrex::FArrayBox> *local_750;
  FabArray<amrex::FArrayBox> *local_748;
  FabArray<amrex::Mask> *local_740;
  FabArray<amrex::FArrayBox> *local_738;
  FabArray<amrex::Mask> *local_730;
  FabArray<amrex::FArrayBox> *local_728;
  FabArray<amrex::Mask> *local_720;
  FabArray<amrex::FArrayBox> *local_718;
  FabArray<amrex::FArrayBox> *local_710;
  FabArray<amrex::FArrayBox> *local_708;
  long local_700;
  long local_6f8;
  ulong local_6f0;
  double local_6e8;
  double dStack_6e0;
  MFIter mfi;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> a_ls;
  Array1D<double,_0,_31> r_ls;
  MFItInfo local_344;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> b_ls;
  double adStack_128 [31];
  
  local_cc8 = CONCAT44(in_register_0000008c,redblack);
  bVar67 = true;
  if (0 < mglev && amrlev == 0) {
    pIVar8 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar67 = false;
    if ((pIVar8[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar8[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      bVar67 = pIVar8[(ulong)(uint)mglev - 1].vect[2] == 2;
    }
  }
  local_7a0 = (long)amrlev * 0x18;
  local_7a8 = (long)mglev;
  lVar60 = *(long *)&(this->m_a_coeffs).
                     super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  lVar34 = local_7a8 * 0x180;
  local_c68 = this;
  local_798 = &sol->super_FabArray<amrex::FArrayBox>;
  local_708 = &rhs->super_FabArray<amrex::FArrayBox>;
  if ((*(long *)(lVar60 + 0xc0 + lVar34) != 0) || (*(int *)(lVar60 + 200 + lVar34) != 0)) {
    Assert_host("acoef.nGrowVect() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
                ,0x294,(char *)0x0);
  }
  lVar63 = local_7a0;
  lVar42 = local_7a8;
  pMVar10 = local_c68;
  local_718 = (FabArray<amrex::FArrayBox> *)
              (local_7a8 * 0x480 +
              *(long *)((long)&(((local_c68->m_b_coeffs).
                                 super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                               ).
                               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_7a0));
  local_710 = (FabArray<amrex::FArrayBox> *)(lVar60 + lVar34);
  local_728 = local_718 + 1;
  local_738 = local_718 + 2;
  lVar60 = *(long *)((long)&(((local_c68->super_MLCellABecLap).super_MLCellLinOp.m_undrrelxr.
                              super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                            ).
                            super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_7a0);
  lVar34 = *(long *)((long)&(((local_c68->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                              super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_7a0);
  lVar29 = local_7a8 * 0x900;
  local_740 = (FabArray<amrex::Mask> *)(lVar34 + lVar29);
  lVar40 = local_7a8 * 0x970;
  local_748 = (FabArray<amrex::FArrayBox> *)(lVar60 + lVar40 + 8);
  local_750 = (FabArray<amrex::FArrayBox> *)(lVar60 + 0x188 + lVar40);
  local_758 = (FabArray<amrex::FArrayBox> *)(lVar60 + 0x308 + lVar40);
  local_760 = (FabArray<amrex::FArrayBox> *)(lVar60 + 0x488 + lVar40);
  local_768 = (FabArray<amrex::FArrayBox> *)(lVar60 + 0x608 + lVar40);
  local_770 = (FabArray<amrex::FArrayBox> *)(lVar60 + lVar40 + 0x788);
  local_720 = local_740 + 1;
  local_730 = local_740 + 2;
  local_778 = (FabArray<amrex::Mask> *)(lVar34 + lVar29 + 0x600);
  local_780 = (FabArray<amrex::Mask> *)(lVar34 + 0x780 + lVar29);
  local_788 = local_740 + 3;
  uVar14 = (*(local_c68->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])
                     (local_c68);
  lVar60 = *(long *)((long)&(((pMVar10->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                              super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar63);
  dVar72 = pMVar10->m_b_scalar;
  pdVar32 = (double *)(lVar60 + 0x20 + lVar42 * 200);
  dVar69 = *pdVar32;
  dVar68 = pdVar32[1];
  auVar70._8_8_ = dVar72;
  auVar70._0_8_ = dVar72;
  auVar71._8_8_ = dVar68 * dVar68;
  auVar71._0_8_ = dVar69 * dVar69;
  auVar71 = divpd(auVar70,auVar71);
  dVar69 = *(double *)(lVar60 + 0x30 + lVar42 * 200);
  dVar72 = dVar72 / (dVar69 * dVar69);
  local_c90 = pMVar10->m_a_scalar;
  local_344.num_streams = Gpu::Device::max_gpu_streams;
  local_344.do_tiling = true;
  local_344.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_344.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_344.tilesize.vect[2] = DAT_007d7ef0;
  local_344.dynamic = true;
  local_344.device_sync = true;
  MFIter::MFIter(&mfi,&local_798->super_FabArrayBase,&local_344);
  local_d68 = auVar71._0_8_;
  dStack_d60 = auVar71._8_8_;
  local_790 = -(ulong)(dStack_d60 < local_d68 || dStack_d60 < dVar72);
  local_998 = 1 - (int)local_790;
  local_994 = -(uint)(local_d68 < dVar72 || local_d68 < dStack_d60);
  if ((local_994 & 1) == 0) {
    local_998 = 0;
  }
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  local_cd0 = (int *)(ulong)uVar14;
  local_6e8 = dVar72;
  dStack_6e0 = dVar72;
  while (mfi.currentIndex < mfi.endIndex) {
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_808,local_740,&mfi);
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_848,local_720,&mfi);
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_888,local_730,&mfi);
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_8c8,local_788,&mfi);
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_908,local_778,&mfi);
    FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_948,local_780,&mfi);
    MFIter::tilebox(&local_7c4,&mfi);
    MFIter::validbox(&local_c84,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d18,local_798,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a00,local_708,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_988,local_710,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a40,local_718,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a80,local_728,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_ac0,local_738,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b00,local_748,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b40,local_750,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b80,local_758,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_bc0,local_760,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_c00,local_768,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_c40,local_770,&mfi);
    iVar27 = local_7c4.bigend.vect[2];
    iVar47 = local_7c4.bigend.vect[1];
    iVar33 = local_7c4.bigend.vect[0];
    iVar13 = local_7c4.smallend.vect[2];
    iVar12 = local_7c4.smallend.vect[1];
    iVar11 = local_7c4.smallend.vect[0];
    iVar28 = local_c84.bigend.vect[2];
    iVar53 = local_c84.bigend.vect[1];
    iVar16 = local_c84.bigend.vect[0];
    iVar46 = local_c84.smallend.vect[2];
    iVar15 = local_c84.smallend.vect[1];
    iVar17 = local_c84.smallend.vect[0];
    this_00 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)((long)&(((local_c68->super_MLCellABecLap).m_overset_mask.
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_7a0) +
               local_7a8 * 8);
    if (this_00 == (FabArray<amrex::IArrayBox> *)0x0) {
      lVar34 = (long)local_7c4.smallend.vect[0];
      lVar63 = (long)local_7c4.bigend.vect[0];
      lVar42 = (long)local_7c4.bigend.vect[1];
      lVar60 = (long)local_7c4.bigend.vect[2];
      local_cd8 = lVar60;
      if (bVar67) {
        piVar41 = (int *)0x0;
        while (piVar64 = piVar41, iVar17 = local_7c4.smallend.vect[2], piVar64 != local_cd0) {
          while (iVar15 = iVar17, iVar15 <= local_7c4.bigend.vect[2]) {
            uVar14 = (int)local_cc8 + iVar15;
            local_c98 = (double *)(ulong)uVar14;
            iVar17 = iVar15 + 1;
            iVar46 = local_7c4.smallend.vect[1];
            while (iVar16 = iVar46, iVar16 <= local_7c4.bigend.vect[1]) {
              if (local_7c4.bigend.vect[0] < local_7c4.smallend.vect[0]) {
                iVar46 = iVar16 + 1;
              }
              else {
                lVar24 = (long)iVar16;
                lVar44 = (long)iVar15;
                lVar63 = (lVar24 - local_a40.begin.y) * local_a40.jstride;
                lVar40 = (lVar44 - local_a40.begin.z) * local_a40.kstride;
                iVar46 = iVar16 + 1;
                lVar29 = (lVar44 - local_a80.begin.z) * local_a80.kstride;
                lVar42 = (iVar16 - local_d18.begin.y) * local_d18.jstride;
                lVar45 = (iVar15 - local_d18.begin.z) * local_d18.kstride;
                lVar25 = (lVar24 - local_ac0.begin.y) * local_ac0.jstride;
                lVar30 = local_d18.nstride * (long)piVar64;
                lVar60 = lVar34;
                do {
                  if ((uVar14 + iVar16 + (int)lVar60 & 1) == 0) {
                    dVar68 = 0.0;
                    dVar69 = 0.0;
                    if ((lVar60 == local_c84.smallend.vect[0]) &&
                       (0 < local_808.p
                            [(lVar24 - local_808.begin.y) * local_808.jstride +
                             (long)(~local_808.begin.x + local_c84.smallend.vect[0]) +
                             (lVar44 - local_808.begin.z) * local_808.kstride])) {
                      dVar69 = local_b00.p
                               [(lVar24 - local_b00.begin.y) * local_b00.jstride +
                                ((long)local_c84.smallend.vect[0] - (long)local_b00.begin.x) +
                                (lVar44 - local_b00.begin.z) * local_b00.kstride +
                                local_b00.nstride * (long)piVar64];
                    }
                    if ((local_c84.smallend.vect[1] == iVar16) &&
                       (0 < local_848.p
                            [(~local_848.begin.y + local_c84.smallend.vect[1]) * local_848.jstride +
                             (lVar44 - local_848.begin.z) * local_848.kstride +
                             (lVar60 - local_848.begin.x)])) {
                      dVar68 = local_b40.p
                               [((long)local_c84.smallend.vect[1] - (long)local_b40.begin.y) *
                                local_b40.jstride +
                                (lVar44 - local_b40.begin.z) * local_b40.kstride +
                                local_b40.nstride * (long)piVar64 + (lVar60 - local_b40.begin.x)];
                    }
                    dVar78 = 0.0;
                    dVar73 = 0.0;
                    if ((local_c84.smallend.vect[2] == iVar15) &&
                       (0 < local_888.p
                            [(lVar24 - local_888.begin.y) * local_888.jstride +
                             (~local_888.begin.z + local_c84.smallend.vect[2]) * local_888.kstride +
                             (lVar60 - local_888.begin.x)])) {
                      dVar73 = local_b80.p
                               [(lVar24 - local_b80.begin.y) * local_b80.jstride +
                                ((long)local_c84.smallend.vect[2] - (long)local_b80.begin.z) *
                                local_b80.kstride +
                                local_b80.nstride * (long)piVar64 + (lVar60 - local_b80.begin.x)];
                    }
                    if ((lVar60 == local_c84.bigend.vect[0]) &&
                       (0 < local_8c8.p
                            [(lVar24 - local_8c8.begin.y) * local_8c8.jstride +
                             (long)((local_c84.bigend.vect[0] - local_8c8.begin.x) + 1) +
                             (lVar44 - local_8c8.begin.z) * local_8c8.kstride])) {
                      dVar78 = local_bc0.p
                               [(lVar24 - local_bc0.begin.y) * local_bc0.jstride +
                                ((long)local_c84.bigend.vect[0] - (long)local_bc0.begin.x) +
                                (lVar44 - local_bc0.begin.z) * local_bc0.kstride +
                                local_bc0.nstride * (long)piVar64];
                    }
                    dVar79 = 0.0;
                    dVar80 = 0.0;
                    if ((local_c84.bigend.vect[1] == iVar16) &&
                       (0 < local_908.p
                            [((local_c84.bigend.vect[1] - local_908.begin.y) + 1) *
                             local_908.jstride +
                             (lVar44 - local_908.begin.z) * local_908.kstride +
                             (lVar60 - local_908.begin.x)])) {
                      dVar80 = local_c00.p
                               [((long)local_c84.bigend.vect[1] - (long)local_c00.begin.y) *
                                local_c00.jstride +
                                (lVar44 - local_c00.begin.z) * local_c00.kstride +
                                local_c00.nstride * (long)piVar64 + (lVar60 - local_c00.begin.x)];
                    }
                    if ((local_c84.bigend.vect[2] == iVar15) &&
                       (0 < local_948.p
                            [(lVar24 - local_948.begin.y) * local_948.jstride +
                             ((local_c84.bigend.vect[2] - local_948.begin.z) + 1) *
                             local_948.kstride + (lVar60 - local_948.begin.x)])) {
                      dVar79 = local_c40.p
                               [(lVar24 - local_c40.begin.y) * local_c40.jstride +
                                ((long)local_c84.bigend.vect[2] - (long)local_c40.begin.z) *
                                local_c40.kstride +
                                local_c40.nstride * (long)piVar64 + (lVar60 - local_c40.begin.x)];
                    }
                    dVar1 = local_a40.p
                            [lVar63 + lVar40 + local_a40.nstride * (long)piVar64 +
                                               (lVar60 - local_a40.begin.x)];
                    dVar2 = local_a40.p
                            [lVar63 + lVar40 + local_a40.nstride * (long)piVar64 +
                                               ((lVar60 + 1) - (long)local_a40.begin.x)];
                    dVar3 = local_a80.p
                            [(iVar16 - local_a80.begin.y) * local_a80.jstride +
                             lVar29 + local_a80.nstride * (long)piVar64 +
                                      (lVar60 - local_a80.begin.x)];
                    dVar4 = local_a80.p
                            [(iVar46 - local_a80.begin.y) * local_a80.jstride +
                             lVar29 + local_a80.nstride * (long)piVar64 +
                                      (lVar60 - local_a80.begin.x)];
                    dVar76 = local_ac0.p
                             [lVar25 + (lVar60 - local_ac0.begin.x) +
                                       (iVar15 - local_ac0.begin.z) * local_ac0.kstride +
                                       local_ac0.nstride * (long)piVar64];
                    dVar5 = local_ac0.p
                            [lVar25 + (lVar60 - local_ac0.begin.x) +
                                      (iVar17 - local_ac0.begin.z) * local_ac0.kstride +
                                      local_ac0.nstride * (long)piVar64];
                    dVar75 = (dVar76 + dVar5) * dStack_6e0 +
                             (dVar3 + dVar4) * dStack_d60 +
                             local_988.p
                             [(lVar24 - local_988.begin.y) * local_988.jstride +
                              (lVar44 - local_988.begin.z) * local_988.kstride +
                              (lVar60 - local_988.begin.x)] * local_c90 +
                             (dVar1 + dVar2) * local_d68;
                    lVar48 = lVar60 - local_d18.begin.x;
                    local_d18.p[lVar42 + lVar48 + lVar45 + lVar30] =
                         (1.15 / (dVar75 - ((dVar73 * dVar76 + dVar79 * dVar5) * local_6e8 +
                                           (dVar69 * dVar1 + dVar78 * dVar2) * local_d68 +
                                           (dVar68 * dVar3 + dVar80 * dVar4) * dStack_d60))) *
                         (local_a00.p
                          [(lVar24 - local_a00.begin.y) * local_a00.jstride +
                           (lVar44 - local_a00.begin.z) * local_a00.kstride +
                           local_a00.nstride * (long)piVar64 + (lVar60 - local_a00.begin.x)] -
                         (dVar75 * local_d18.p[lVar42 + lVar48 + lVar45 + lVar30] -
                         ((dVar76 * local_d18.p
                                    [lVar42 + lVar48 + (~local_d18.begin.z + iVar15) *
                                                       local_d18.kstride + lVar30] +
                          dVar5 * local_d18.p
                                  [lVar42 + lVar48 + (iVar17 - local_d18.begin.z) *
                                                     local_d18.kstride + lVar30]) * dVar72 +
                         (dVar1 * local_d18.p
                                  [lVar42 + lVar45 + lVar30 + ((int)lVar60 + ~local_d18.begin.x)] +
                         dVar2 * local_d18.p
                                 [lVar42 + lVar45 + lVar30 + ((lVar60 + 1) - (long)local_d18.begin.x
                                                             )]) * local_d68 +
                         (dVar3 * local_d18.p
                                  [(~local_d18.begin.y + iVar16) * local_d18.jstride +
                                   lVar45 + lVar30 + lVar48] +
                         dVar4 * local_d18.p
                                 [(iVar46 - local_d18.begin.y) * local_d18.jstride +
                                  lVar45 + lVar30 + lVar48]) * dStack_d60))) +
                         local_d18.p[lVar42 + lVar48 + lVar45 + lVar30];
                  }
                  lVar60 = lVar60 + 1;
                } while (local_7c4.bigend.vect[0] + 1 != (int)lVar60);
              }
            }
          }
          local_ca0 = piVar64;
          piVar41 = (int *)((long)piVar64 + 1);
        }
      }
      else {
        lVar29 = (long)local_c84.smallend.vect[0];
        lVar40 = (long)local_c84.smallend.vect[1];
        lVar24 = (long)local_c84.smallend.vect[2];
        lVar25 = (long)local_c84.bigend.vect[0];
        uVar14 = local_7c4.bigend.vect[1] - local_7c4.smallend.vect[1];
        if ((local_790 & 1) != 0) {
          uVar14 = local_7c4.bigend.vect[2] - local_7c4.smallend.vect[2];
        }
        lVar30 = (long)local_c84.bigend.vect[1];
        uVar9 = local_7c4.bigend.vect[0] - local_7c4.smallend.vect[0];
        if ((local_994 & 1) != 0) {
          uVar9 = uVar14;
        }
        lVar44 = (long)local_c84.bigend.vect[2];
        if (0x1f < (int)uVar9) {
          Abort_host("abec_gsrb_with_line_solve is hard-wired to be no longer than 32");
        }
        iVar18 = iVar16 + 1;
        iVar19 = iVar53 + 1;
        uVar14 = 0;
        if (0 < (int)uVar9) {
          uVar14 = uVar9;
        }
        iVar22 = iVar28 + 1;
        local_9b8 = (ulong)uVar9;
        uVar20 = (ulong)uVar14;
        if (local_998 == 2) {
          lVar34 = (long)iVar13;
          iVar28 = iVar33 + 1;
          local_c58 = lVar29 * 8;
          local_9c0 = lVar25 * 8;
          local_c48 = (double *)(lVar34 + 1);
          local_cc0 = 0;
          local_c60 = (int *)CONCAT44(local_c60._4_4_,iVar28);
          for (piVar41 = (int *)0x0; iVar27 = iVar12, piVar41 != local_cd0;
              piVar41 = (int *)((long)piVar41 + 1)) {
            while (iVar23 = iVar27, iVar23 <= iVar47) {
              if (iVar33 < iVar11) {
                iVar27 = iVar23 + 1;
              }
              else {
                uVar36 = (ulong)(uint)((int)local_cc8 + iVar23);
                iVar27 = iVar23 + 1;
                iVar39 = iVar11;
                local_c50 = uVar36;
                do {
                  lVar42 = local_cd8;
                  if (((int)uVar36 + iVar39 & 1U) == 0) {
                    lVar45 = (long)iVar39;
                    lVar29 = (long)iVar23;
                    lVar62 = (lVar29 - local_888.begin.y) * local_888.jstride;
                    lVar43 = (lVar29 - local_948.begin.y) * local_948.jstride;
                    local_c98 = local_c40.p +
                                (lVar29 - local_c40.begin.y) * local_c40.jstride +
                                (lVar45 - local_c40.begin.x) +
                                (lVar44 - local_c40.begin.z) * local_c40.kstride;
                    lVar40 = (long)local_d18.begin.x;
                    local_cb0 = local_d18.p +
                                local_d18.jstride * (iVar23 - local_d18.begin.y) +
                                (long)(iVar39 - local_d18.begin.x) +
                                (~local_d18.begin.z + iVar13) * local_d18.kstride;
                    local_9a8 = (double *)
                                ((lVar34 - local_8c8.begin.z) * local_8c8.kstride * 4 +
                                 (iVar23 - local_8c8.begin.y) * local_8c8.jstride * 4 +
                                (long)(iVar18 - local_8c8.begin.x) * 4);
                    lVar63 = (lVar34 - local_808.begin.z) * local_808.kstride * 4 +
                             (iVar23 - local_808.begin.y) * local_808.jstride * 4;
                    lVar37 = local_848.kstride * 4;
                    lVar25 = (lVar34 - local_848.begin.z) * lVar37;
                    local_e98 = (long)(~local_848.begin.y + iVar15) * local_848.jstride * 4 + lVar25
                                + (long)local_848.begin.x * -4 + (long)local_848.p;
                    lVar59 = local_848.jstride * 4 * (long)(iVar15 + ~local_848.begin.y) + lVar25 +
                             (long)local_848.begin.x * -4 + (long)local_848.p;
                    local_ec0 = (int *)(lVar63 + (long)(~local_808.begin.x + iVar17) * 4 +
                                       (long)local_808.p);
                    local_e30 = (int *)(lVar63 + (long)(iVar17 + ~local_808.begin.x) * 4 +
                                       (long)local_808.p);
                    local_db8 = (double *)
                                ((long)local_b00.p +
                                local_b00.nstride * local_cc0 +
                                (lVar34 - local_b00.begin.z) * local_b00.kstride * 8 +
                                (iVar23 - local_b00.begin.y) * local_b00.jstride * 8 +
                                (long)local_b00.begin.x * -8 + local_c58);
                    local_ee8 = (double *)
                                ((long)local_bc0.p +
                                local_bc0.nstride * local_cc0 +
                                (lVar34 - local_bc0.begin.z) * local_bc0.kstride * 8 +
                                (iVar23 - local_bc0.begin.y) * local_bc0.jstride * 8 +
                                (long)local_bc0.begin.x * -8 + local_9c0);
                    lVar52 = local_d18.kstride * 8;
                    lVar30 = (lVar34 - local_d18.begin.z) * lVar52;
                    lVar48 = local_d18.jstride * 8;
                    lVar31 = local_d18.nstride * local_cc0;
                    lVar63 = lVar30 + lVar31;
                    local_cb8 = lVar48 * (iVar23 - local_d18.begin.y);
                    lVar49 = local_a80.kstride * 8;
                    lVar25 = local_a80.nstride * local_cc0 + (lVar34 - local_a80.begin.z) * lVar49;
                    local_f10 = (long)(iVar27 - local_a80.begin.y) * local_a80.jstride * 8 + lVar25
                                + (long)local_a80.begin.x * -8 + (long)local_a80.p;
                    local_f18 = local_a80.jstride * 8 * (long)(iVar23 - local_a80.begin.y) + lVar25
                                + (long)local_a80.begin.x * -8 + (long)local_a80.p;
                    lVar30 = lVar30 + local_cb8;
                    local_cb8 = lVar31 + lVar45 * 8 + local_cb8;
                    iVar28 = iVar39 + 1;
                    local_9b0 = CONCAT44(local_9b0._4_4_,iVar28);
                    local_f28 = (iVar27 - local_d18.begin.y) * lVar48 + lVar63 + lVar40 * -8 +
                                (long)local_d18.p;
                    local_ef8 = (~local_d18.begin.y + iVar23) * lVar48 + lVar63 + lVar40 * -8 +
                                (long)local_d18.p;
                    lVar38 = lVar30 + (long)iVar28 * 8 + lVar40 * -8 + (long)local_d18.p;
                    local_e90 = lVar30 + (long)(~local_d18.begin.x + iVar39) * 8 + (long)local_d18.p
                    ;
                    local_f08 = ((long)local_c48 - (long)local_d18.begin.z) * lVar52 + lVar40 * -8 +
                                (long)local_d18.p;
                    lVar63 = (iVar23 - local_ac0.begin.y) * local_ac0.jstride;
                    lVar40 = local_ac0.kstride * 8;
                    lVar58 = (lVar34 - local_ac0.begin.z) * lVar40 + lVar63 * 8 +
                             local_ac0.nstride * local_cc0 + (long)local_ac0.begin.x * -8 +
                             (long)local_ac0.p;
                    lVar54 = ((long)local_c48 - (long)local_ac0.begin.z) * lVar40 + lVar63 * 8 +
                             local_ac0.nstride * local_cc0 + (long)local_ac0.begin.x * -8 +
                             (long)local_ac0.p;
                    local_ca0 = (int *)(local_b80.nstride * (long)piVar41);
                    lVar25 = (iVar22 - local_948.begin.z) * local_948.kstride;
                    local_9a0 = (double *)(local_c40.nstride * (long)piVar41);
                    lVar50 = (lVar34 - local_988.begin.z) * local_988.kstride * 8 +
                             (iVar23 - local_988.begin.y) * local_988.jstride * 8 +
                             (long)local_988.begin.x * -8 + (long)local_988.p;
                    lVar30 = (lVar34 - local_908.begin.z) * local_908.kstride * 4 +
                             (iVar19 - local_908.begin.y) * local_908.jstride * 4 +
                             (long)local_908.begin.x * -4 + (long)local_908.p;
                    piVar64 = (int *)((long)local_9a8 + (long)local_8c8.p);
                    local_e78 = local_b40.nstride * local_cc0 +
                                (lVar34 - local_b40.begin.z) * local_b40.kstride * 8 +
                                (iVar15 - local_b40.begin.y) * local_b40.jstride * 8 +
                                (long)local_b40.begin.x * -8 + (long)local_b40.p;
                    local_ef0 = (double *)
                                (local_c00.nstride * local_cc0 +
                                 (lVar34 - local_c00.begin.z) * local_c00.kstride * 8 +
                                 (iVar53 - local_c00.begin.y) * local_c00.jstride * 8 +
                                 (long)local_c00.begin.x * -8 + (long)local_c00.p);
                    local_ca8 = (double *)(local_d18.nstride * (long)piVar41);
                    lVar35 = local_a00.nstride * local_cc0 +
                             (lVar34 - local_a00.begin.z) * local_a00.kstride * 8 +
                             (iVar23 - local_a00.begin.y) * local_a00.jstride * 8 +
                             (long)local_a00.begin.x * -8 + (long)local_a00.p;
                    lVar51 = local_a40.nstride * local_cc0 +
                             (lVar34 - local_a40.begin.z) * local_a40.kstride * 8 +
                             (iVar23 - local_a40.begin.y) * local_a40.jstride * 8 +
                             (long)local_a40.begin.x * -8 + (long)local_a40.p;
                    lVar63 = lVar45 * 8;
                    for (lVar48 = 0; lVar34 + lVar48 <= local_cd8; lVar48 = lVar48 + 1) {
                      dVar68 = 0.0;
                      dVar69 = 0.0;
                      if ((iVar39 == iVar17) && (0 < *local_e30)) {
                        dVar69 = *local_db8;
                      }
                      if ((iVar23 == iVar15) && (0 < *(int *)(lVar59 + lVar45 * 4))) {
                        dVar68 = *(double *)(local_e78 + lVar63);
                      }
                      dVar78 = 0.0;
                      dVar73 = 0.0;
                      if (((lVar34 - lVar24) + lVar48 == 0) &&
                         (0 < local_888.p
                              [lVar62 + (lVar45 - local_888.begin.x) +
                                        (iVar46 + ~local_888.begin.z) * local_888.kstride])) {
                        dVar73 = local_b80.p
                                 [(long)local_ca0 +
                                  (lVar29 - local_b80.begin.y) * local_b80.jstride +
                                  (lVar45 - local_b80.begin.x) +
                                  (lVar24 - local_b80.begin.z) * local_b80.kstride];
                      }
                      if ((iVar39 == iVar16) && (0 < *piVar64)) {
                        dVar78 = *local_ee8;
                      }
                      dVar79 = 0.0;
                      dVar80 = 0.0;
                      if ((iVar23 == iVar53) && (0 < *(int *)(lVar30 + lVar45 * 4))) {
                        dVar80 = *(double *)((long)local_ef0 + lVar63);
                      }
                      if (((lVar34 - lVar44) + lVar48 == 0) &&
                         (0 < local_948.p[lVar43 + (lVar45 - local_948.begin.x) + lVar25])) {
                        dVar79 = local_c98[(long)local_9a0];
                      }
                      dVar1 = *(double *)(lVar51 + lVar63);
                      dVar2 = *(double *)(lVar51 + (long)iVar28 * 8);
                      dVar3 = *(double *)(local_f18 + lVar63);
                      dVar4 = *(double *)(local_f10 + lVar63);
                      dVar76 = (dVar1 * *(double *)(local_e90 + lVar31) +
                               dVar2 * *(double *)(lVar38 + lVar31)) * local_d68 +
                               (dVar3 * *(double *)(local_ef8 + lVar63) +
                               dVar4 * *(double *)(local_f28 + lVar63)) * dStack_d60;
                      if ((iVar39 == iVar17) && (0 < *local_ec0)) {
                        dVar76 = dVar76 - local_d68 * dVar1 * *(double *)(local_e90 + lVar31);
                      }
                      dVar5 = *(double *)(lVar50 + lVar63);
                      dVar75 = *(double *)(lVar58 + lVar63);
                      dVar74 = *(double *)(lVar54 + lVar63);
                      if ((iVar39 == iVar16) && (0 < *piVar64)) {
                        dVar76 = dVar76 - local_d68 * dVar2 * *(double *)(lVar38 + lVar31);
                      }
                      if ((iVar23 == iVar15) && (0 < *(int *)(local_e98 + lVar45 * 4))) {
                        dVar76 = dVar76 - dStack_d60 * dVar3 * *(double *)(local_ef8 + lVar63);
                      }
                      if ((iVar23 == iVar53) && (0 < *(int *)(lVar30 + lVar45 * 4))) {
                        dVar76 = dVar76 - dStack_d60 * dVar4 * *(double *)(local_f28 + lVar63);
                      }
                      a_ls.arr[lVar48] = dVar75 * -dVar72;
                      b_ls.arr[lVar48] =
                           ((dVar75 + dVar74) * dVar72 +
                           (dVar3 + dVar4) * dStack_d60 +
                           dVar5 * local_c90 + (dVar1 + dVar2) * local_d68) -
                           ((dVar73 * dVar75 + dVar79 * dVar74) * dVar72 +
                           (dVar1 * dVar69 + dVar2 * dVar78) * local_d68 +
                           (dVar3 * dVar68 + dVar4 * dVar80) * dStack_d60);
                      c_ls.arr[lVar48] = dVar74 * -dVar72;
                      u_ls.arr[lVar48] = 0.0;
                      dVar76 = dVar76 + *(double *)(lVar35 + lVar63);
                      r_ls.arr[lVar48] = dVar76;
                      if ((lVar48 == 0) &&
                         (a_ls.arr[0] = 0.0,
                         local_888.p
                         [lVar62 + (lVar45 - local_888.begin.x) +
                                   (~local_888.begin.z + iVar46) * local_888.kstride] < 1)) {
                        dVar76 = dVar76 + dVar75 * dVar72 * local_cb0[(long)local_ca8];
                        r_ls.arr[0] = dVar76;
                      }
                      if (((lVar34 - lVar60) + lVar48 == 0) &&
                         (c_ls.arr[lVar48] = 0.0,
                         local_948.p[lVar43 + (lVar45 - local_948.begin.x) + lVar25] < 1)) {
                        r_ls.arr[lVar48] =
                             dVar74 * dVar72 * *(double *)(local_f08 + local_cb8) + dVar76;
                      }
                      lVar50 = lVar50 + local_988.kstride * 8;
                      lVar30 = lVar30 + local_908.kstride * 4;
                      local_e98 = local_e98 + lVar37;
                      piVar64 = piVar64 + local_8c8.kstride;
                      local_ec0 = local_ec0 + local_808.kstride;
                      lVar59 = lVar59 + lVar37;
                      local_e30 = local_e30 + local_808.kstride;
                      local_db8 = local_db8 + local_b00.kstride;
                      local_e78 = local_e78 + local_b40.kstride * 8;
                      local_ee8 = local_ee8 + local_bc0.kstride;
                      local_ef0 = (double *)((long)local_ef0 + local_c00.kstride * 8);
                      lVar35 = lVar35 + local_a00.kstride * 8;
                      local_f28 = local_f28 + lVar52;
                      local_ef8 = local_ef8 + lVar52;
                      lVar38 = lVar38 + lVar52;
                      local_e90 = local_e90 + lVar52;
                      lVar58 = lVar58 + lVar40;
                      local_f10 = local_f10 + lVar49;
                      local_f18 = local_f18 + lVar49;
                      lVar51 = lVar51 + local_a40.kstride * 8;
                      local_f08 = local_f08 + lVar52;
                      lVar54 = lVar54 + lVar40;
                    }
                    local_f38 = b_ls.arr[0];
                    dVar69 = r_ls.arr[0] / b_ls.arr[0];
                    u_ls.arr[0] = dVar69;
                    for (uVar36 = 0; uVar21 = local_9b8, uVar20 != uVar36; uVar36 = uVar36 + 1) {
                      local_f38 = c_ls.arr[uVar36] / local_f38;
                      adStack_128[uVar36] = local_f38;
                      dVar68 = a_ls.arr[uVar36 + 1];
                      local_f38 = b_ls.arr[uVar36 + 1] - local_f38 * dVar68;
                      if ((local_f38 == 0.0) && (!NAN(local_f38))) {
                        Abort_host(">>>TRIDIAG FAILED");
                      }
                      dVar69 = (dVar69 * -dVar68 + r_ls.arr[uVar36 + 1]) / local_f38;
                      u_ls.arr[uVar36 + 1] = dVar69;
                    }
                    for (; 0 < (int)uVar21; uVar21 = uVar21 - 1) {
                      u_ls.arr[uVar21 - 1] =
                           u_ls.arr[uVar21 - 1] - adStack_128[uVar21 - 1] * u_ls.arr[uVar21];
                    }
                    puVar26 = (undefined8 *)
                              (local_d18.nstride * local_cc0 +
                               (lVar34 - local_d18.begin.z) * local_d18.kstride * 8 +
                               (iVar23 - local_d18.begin.y) * local_d18.jstride * 8 + lVar45 * 8 +
                               (long)local_d18.begin.x * -8 + (long)local_d18.p);
                    pdVar32 = u_ls.arr;
                    for (lVar63 = lVar34; lVar63 <= lVar42; lVar63 = lVar63 + 1) {
                      *puVar26 = *pdVar32;
                      puVar26 = puVar26 + local_d18.kstride;
                      pdVar32 = pdVar32 + 1;
                    }
                    uVar36 = local_c50;
                    iVar28 = (int)local_c60;
                    iVar39 = (int)local_9b0;
                  }
                  else {
                    iVar39 = iVar39 + 1;
                  }
                } while (iVar39 != iVar28);
              }
            }
            local_cc0 = local_cc0 + 8;
          }
        }
        else if (local_998 == 1) {
          lVar34 = (long)iVar12;
          iVar27 = iVar27 + 1;
          local_6f8 = lVar29 * 8;
          local_700 = lVar25 * 8;
          local_c58 = lVar34 + 1;
          local_de0 = 0;
          local_98c = iVar27;
          for (piVar41 = (int *)0x0; piVar64 = piVar41, iVar53 = iVar11, piVar41 != local_cd0;
              piVar41 = (int *)((long)piVar41 + 1)) {
            while (iVar47 = iVar53, local_c60 = piVar64, iVar47 <= iVar33) {
              if ((int)lVar60 < iVar13) {
                piVar64 = local_c60;
                iVar53 = iVar47 + 1;
              }
              else {
                uVar36 = (ulong)(uint)(iVar47 + (int)local_cc8);
                local_990 = iVar47 + 1;
                lVar24 = (long)iVar47;
                lVar63 = lVar24 * 8;
                lVar29 = (long)local_990;
                iVar23 = iVar13;
                local_6f0 = uVar36;
                do {
                  if (((int)uVar36 + iVar23 & 1U) == 0) {
                    lVar35 = (long)local_a80.begin.x;
                    iVar53 = iVar23 + 1;
                    local_c50 = CONCAT44(local_c50._4_4_,iVar53);
                    lVar25 = (long)iVar23;
                    local_9a0 = local_b40.p +
                                (lVar40 - local_b40.begin.y) * local_b40.jstride +
                                (lVar24 - local_b40.begin.x) +
                                (lVar25 - local_b40.begin.z) * local_b40.kstride;
                    lVar43 = (iVar19 - local_908.begin.y) * local_908.jstride;
                    local_ca8 = local_c00.p +
                                (lVar30 - local_c00.begin.y) * local_c00.jstride +
                                (lVar24 - local_c00.begin.x) +
                                (lVar25 - local_c00.begin.z) * local_c00.kstride;
                    local_c98 = (double *)
                                (local_848.p +
                                (iVar15 + ~local_848.begin.y) * local_848.jstride +
                                (lVar24 - local_848.begin.x));
                    local_ca0 = local_848.p +
                                (~local_848.begin.y + iVar15) * local_848.jstride +
                                (lVar24 - local_848.begin.x);
                    lVar44 = lVar34 - local_a80.begin.y;
                    lVar45 = (long)local_d18.begin.x;
                    local_c48 = local_d18.p +
                                (~local_d18.begin.y + iVar12) * local_d18.jstride +
                                (long)(iVar47 - local_d18.begin.x) +
                                local_d18.kstride * (iVar23 - local_d18.begin.z);
                    lVar50 = local_948.jstride * 4;
                    local_9c0 = (lVar34 - local_8c8.begin.y) * local_8c8.jstride * 4 +
                                (iVar23 - local_8c8.begin.z) * local_8c8.kstride * 4 +
                                (long)(iVar18 - local_8c8.begin.x) * 4;
                    lVar60 = (lVar34 - local_808.begin.y) * local_808.jstride * 4 +
                             (iVar23 - local_808.begin.z) * local_808.kstride * 4;
                    lVar54 = local_888.jstride * 4;
                    lVar48 = (lVar34 - local_888.begin.y) * lVar54;
                    local_ef8 = (long)(~local_888.begin.z + iVar46) * local_888.kstride * 4 + lVar48
                                + (long)local_888.begin.x * -4 + (long)local_888.p;
                    local_ec8 = local_888.kstride * 4 * (long)(iVar46 + ~local_888.begin.z) + lVar48
                                + (long)local_888.begin.x * -4 + (long)local_888.p;
                    local_e38 = (int *)(lVar60 + (long)(~local_808.begin.x + iVar17) * 4 +
                                       (long)local_808.p);
                    piVar64 = (int *)(lVar60 + (long)(iVar17 + ~local_808.begin.x) * 4 +
                                     (long)local_808.p);
                    local_ee8 = (double *)
                                ((long)local_b00.p +
                                local_b00.nstride * local_de0 +
                                (lVar34 - local_b00.begin.y) * local_b00.jstride * 8 +
                                (iVar23 - local_b00.begin.z) * local_b00.kstride * 8 +
                                (long)local_b00.begin.x * -8 + local_6f8);
                    local_ef0 = (double *)
                                ((long)local_bc0.p +
                                local_bc0.nstride * local_de0 +
                                (lVar34 - local_bc0.begin.y) * local_bc0.jstride * 8 +
                                (iVar23 - local_bc0.begin.z) * local_bc0.kstride * 8 +
                                (long)local_bc0.begin.x * -8 + local_700);
                    lVar48 = local_d18.jstride * 8;
                    lVar51 = (lVar34 - local_d18.begin.y) * lVar48;
                    lVar37 = local_d18.kstride * 8;
                    lVar31 = local_d18.nstride * local_de0;
                    lVar60 = lVar51 + lVar31;
                    lVar38 = lVar37 * (iVar23 - local_d18.begin.z);
                    lVar51 = lVar51 + lVar38;
                    lVar52 = (long)local_d18.p + lVar51 + lVar45 * -8 + lVar29 * 8;
                    lVar58 = local_ac0.jstride * 8;
                    lVar62 = local_ac0.nstride * local_de0 + (lVar34 - local_ac0.begin.y) * lVar58;
                    lVar49 = (long)(iVar23 - local_ac0.begin.z) * local_ac0.kstride * 8 + lVar62 +
                             (long)local_ac0.begin.x * -8 + (long)local_ac0.p;
                    local_f10 = local_ac0.kstride * 8 * (long)(iVar53 - local_ac0.begin.z) + lVar62
                                + (long)local_ac0.begin.x * -8 + (long)local_ac0.p;
                    local_cc0 = lVar38 + lVar63 + lVar31;
                    local_f28 = (iVar53 - local_d18.begin.z) * lVar37 + lVar60 + lVar45 * -8 +
                                (long)local_d18.p;
                    lVar59 = (~local_d18.begin.z + iVar23) * lVar37 + lVar60 + lVar45 * -8 +
                             (long)local_d18.p;
                    local_f20 = lVar51 + (long)(~local_d18.begin.x + iVar47) * 8 + (long)local_d18.p
                    ;
                    lVar62 = (local_c58 - local_d18.begin.y) * lVar48 + lVar45 * -8 +
                             (long)local_d18.p;
                    lVar60 = (iVar23 - local_a80.begin.z) * local_a80.kstride;
                    local_9a8 = local_a80.p +
                                local_a80.jstride * lVar44 + (lVar24 - lVar35) + lVar60;
                    lVar37 = local_a80.jstride * 8;
                    local_e90 = (local_c58 - local_a80.begin.y) * lVar37 + lVar60 * 8 +
                                local_a80.nstride * local_de0 + lVar35 * -8;
                    local_f18 = lVar44 * lVar37 + lVar60 * 8 + local_a80.nstride * local_de0 +
                                lVar35 * -8 + (long)local_a80.p;
                    local_e98 = (long)local_a80.p + local_e90;
                    local_e90 = local_e90 + (long)local_a80.p;
                    lVar44 = (lVar25 - local_848.begin.z) * local_848.kstride;
                    local_cb0 = (double *)(local_b40.nstride * (long)local_c60);
                    lVar60 = (lVar25 - local_908.begin.z) * local_908.kstride;
                    local_cb8 = local_c00.nstride * (long)local_c60;
                    local_9b0 = local_a80.nstride * (long)local_c60;
                    lVar38 = (lVar34 - local_988.begin.y) * local_988.jstride * 8 +
                             (iVar23 - local_988.begin.z) * local_988.kstride * 8 +
                             (long)local_988.begin.x * -8 + (long)local_988.p;
                    lVar35 = (lVar34 - local_948.begin.y) * lVar50 +
                             (iVar22 - local_948.begin.z) * local_948.kstride * 4 +
                             (long)local_948.begin.x * -4 + (long)local_948.p;
                    piVar41 = (int *)(local_9c0 + (long)local_8c8.p);
                    local_e78 = local_b80.nstride * local_de0 +
                                (lVar34 - local_b80.begin.y) * local_b80.jstride * 8 +
                                (iVar46 - local_b80.begin.z) * local_b80.kstride * 8 +
                                (long)local_b80.begin.x * -8 + (long)local_b80.p;
                    local_db8 = (double *)
                                (local_c40.nstride * local_de0 +
                                 (lVar34 - local_c40.begin.y) * local_c40.jstride * 8 +
                                 (iVar28 - local_c40.begin.z) * local_c40.kstride * 8 +
                                 (long)local_c40.begin.x * -8 + (long)local_c40.p);
                    local_f38 = (double)(local_a00.nstride * local_de0 +
                                         (lVar34 - local_a00.begin.y) * local_a00.jstride * 8 +
                                         (iVar23 - local_a00.begin.z) * local_a00.kstride * 8 +
                                         (long)local_a00.begin.x * -8 + (long)local_a00.p);
                    lVar45 = local_a40.nstride * local_de0 +
                             (lVar34 - local_a40.begin.y) * local_a40.jstride * 8 +
                             (iVar23 - local_a40.begin.z) * local_a40.kstride * 8 +
                             (long)local_a40.begin.x * -8 + (long)local_a40.p;
                    local_ed0 = lVar35;
                    for (lVar25 = 0; lVar34 + lVar25 <= lVar42; lVar25 = lVar25 + 1) {
                      dVar68 = 0.0;
                      dVar69 = 0.0;
                      if ((iVar47 == iVar17) && (0 < *piVar64)) {
                        dVar69 = *local_ee8;
                      }
                      if (((lVar34 - lVar40) + lVar25 == 0) &&
                         (0 < *(int *)((long)local_c98 + lVar44 * 4))) {
                        dVar68 = local_9a0[(long)local_cb0];
                      }
                      dVar78 = 0.0;
                      dVar73 = 0.0;
                      if ((iVar23 == iVar46) && (0 < *(int *)(local_ec8 + lVar24 * 4))) {
                        dVar73 = *(double *)(local_e78 + lVar63);
                      }
                      if ((iVar47 == iVar16) && (0 < *piVar41)) {
                        dVar78 = *local_ef0;
                      }
                      dVar79 = 0.0;
                      dVar80 = 0.0;
                      if (((lVar34 - lVar30) + lVar25 == 0) &&
                         (0 < local_908.p[lVar43 + (lVar24 - local_908.begin.x) + lVar60])) {
                        dVar80 = local_ca8[local_cb8];
                      }
                      if ((iVar23 == iVar28) && (0 < *(int *)(lVar35 + lVar24 * 4))) {
                        dVar79 = *(double *)((long)local_db8 + lVar63);
                      }
                      dVar1 = *(double *)(lVar45 + lVar63);
                      dVar2 = *(double *)(lVar45 + lVar29 * 8);
                      dVar3 = *(double *)(lVar49 + lVar63);
                      dVar4 = *(double *)(local_f10 + lVar63);
                      dVar76 = (dVar1 * *(double *)(local_f20 + lVar31) +
                               dVar2 * *(double *)(lVar52 + lVar31)) * local_d68 +
                               (dVar3 * *(double *)(lVar59 + lVar63) +
                               dVar4 * *(double *)(local_f28 + lVar63)) * dVar72;
                      if ((iVar47 == iVar17) && (0 < *local_e38)) {
                        dVar76 = dVar76 - local_d68 * dVar1 * *(double *)(local_f20 + lVar31);
                      }
                      dVar5 = *(double *)(lVar38 + lVar63);
                      dVar75 = *(double *)(local_f18 + lVar63);
                      dVar74 = *(double *)(local_e90 + lVar63);
                      if ((iVar47 == iVar16) && (0 < *piVar41)) {
                        dVar76 = dVar76 - local_d68 * dVar2 * *(double *)(lVar52 + lVar31);
                      }
                      if ((iVar23 == iVar46) && (0 < *(int *)(local_ef8 + lVar24 * 4))) {
                        dVar76 = dVar76 - dVar72 * dVar3 * *(double *)(lVar59 + lVar63);
                      }
                      if ((iVar23 == iVar28) && (0 < *(int *)(local_ed0 + lVar24 * 4))) {
                        dVar76 = dVar76 - dVar72 * dVar4 * *(double *)(local_f28 + lVar63);
                      }
                      a_ls.arr[lVar25] = dVar75 * -dStack_d60;
                      b_ls.arr[lVar25] =
                           ((dVar3 + dVar4) * dVar72 +
                           (dVar75 + dVar74) * dStack_d60 +
                           dVar5 * local_c90 + (dVar1 + dVar2) * local_d68) -
                           ((dVar3 * dVar73 + dVar4 * dVar79) * dVar72 +
                           (dVar1 * dVar69 + dVar2 * dVar78) * local_d68 +
                           (dVar68 * dVar75 + dVar74 * dVar80) * dStack_d60);
                      dVar69 = *(double *)(local_e98 + lVar63);
                      c_ls.arr[lVar25] = dVar69 * -dStack_d60;
                      u_ls.arr[lVar25] = 0.0;
                      dVar76 = dVar76 + *(double *)((long)local_f38 + lVar63);
                      r_ls.arr[lVar25] = dVar76;
                      if ((lVar25 == 0) && (a_ls.arr[0] = 0.0, local_ca0[lVar44] < 1)) {
                        dVar76 = dVar76 + local_9a8[local_9b0] * dStack_d60 *
                                          local_c48[local_d18.nstride * (long)local_c60];
                        r_ls.arr[0] = dVar76;
                      }
                      if (((lVar34 - lVar42) + lVar25 == 0) &&
                         (c_ls.arr[lVar25] = 0.0,
                         local_908.p[lVar43 + (lVar24 - local_908.begin.x) + lVar60] < 1)) {
                        r_ls.arr[lVar25] =
                             dVar69 * dStack_d60 * *(double *)(lVar62 + local_cc0) + dVar76;
                      }
                      lVar38 = lVar38 + local_988.jstride * 8;
                      local_ed0 = local_ed0 + lVar50;
                      local_ef8 = local_ef8 + lVar54;
                      piVar41 = piVar41 + local_8c8.jstride;
                      local_e38 = local_e38 + local_808.jstride;
                      lVar35 = lVar35 + lVar50;
                      local_ec8 = local_ec8 + lVar54;
                      piVar64 = piVar64 + local_808.jstride;
                      local_ee8 = local_ee8 + local_b00.jstride;
                      local_e78 = local_e78 + local_b80.jstride * 8;
                      local_ef0 = local_ef0 + local_bc0.jstride;
                      local_db8 = (double *)((long)local_db8 + local_c40.jstride * 8);
                      local_f38 = (double)((long)local_f38 + local_a00.jstride * 8);
                      local_f28 = local_f28 + lVar48;
                      lVar59 = lVar59 + lVar48;
                      lVar52 = lVar52 + lVar48;
                      local_f20 = local_f20 + lVar48;
                      lVar49 = lVar49 + lVar58;
                      local_f10 = local_f10 + lVar58;
                      local_f18 = local_f18 + lVar37;
                      lVar45 = lVar45 + local_a40.jstride * 8;
                      lVar62 = lVar62 + lVar48;
                      local_e98 = local_e98 + lVar37;
                      local_e90 = local_e90 + lVar37;
                    }
                    local_f38 = b_ls.arr[0];
                    dVar69 = r_ls.arr[0] / b_ls.arr[0];
                    u_ls.arr[0] = dVar69;
                    for (uVar36 = 0; uVar21 = local_9b8, uVar20 != uVar36; uVar36 = uVar36 + 1) {
                      local_f38 = c_ls.arr[uVar36] / local_f38;
                      adStack_128[uVar36] = local_f38;
                      dVar68 = a_ls.arr[uVar36 + 1];
                      local_f38 = b_ls.arr[uVar36 + 1] - local_f38 * dVar68;
                      if ((local_f38 == 0.0) && (!NAN(local_f38))) {
                        Abort_host(">>>TRIDIAG FAILED");
                      }
                      dVar69 = (dVar69 * -dVar68 + r_ls.arr[uVar36 + 1]) / local_f38;
                      u_ls.arr[uVar36 + 1] = dVar69;
                    }
                    for (; 0 < (int)uVar21; uVar21 = uVar21 - 1) {
                      u_ls.arr[uVar21 - 1] =
                           u_ls.arr[uVar21 - 1] - adStack_128[uVar21 - 1] * u_ls.arr[uVar21];
                    }
                    puVar26 = (undefined8 *)
                              ((long)local_d18.p +
                              local_d18.nstride * local_de0 +
                              (lVar34 - local_d18.begin.y) * local_d18.jstride * 8 +
                              (iVar23 - local_d18.begin.z) * local_d18.kstride * 8 +
                              (long)local_d18.begin.x * -8 + lVar63);
                    pdVar32 = u_ls.arr;
                    for (lVar60 = lVar34; lVar60 <= lVar42; lVar60 = lVar60 + 1) {
                      *puVar26 = *pdVar32;
                      puVar26 = puVar26 + local_d18.jstride;
                      pdVar32 = pdVar32 + 1;
                    }
                    uVar36 = local_6f0;
                    lVar60 = local_cd8;
                    iVar27 = local_98c;
                    iVar23 = (int)local_c50;
                  }
                  else {
                    iVar23 = iVar23 + 1;
                  }
                  piVar41 = local_c60;
                  piVar64 = local_c60;
                  iVar53 = local_990;
                } while (iVar23 != iVar27);
              }
            }
            local_de0 = local_de0 + 8;
          }
        }
        else {
          lVar42 = lVar34 * 8;
          lVar40 = lVar34 * 4;
          local_ee0 = 0;
          for (piVar41 = (int *)0x0; iVar16 = iVar12, piVar41 != local_cd0;
              piVar41 = (int *)((long)piVar41 + 1)) {
            while (iVar33 = iVar16, iVar33 <= iVar47) {
              if ((int)lVar60 < iVar13) {
                iVar16 = iVar33 + 1;
              }
              else {
                iVar23 = (int)local_cc8;
                iVar16 = iVar33 + 1;
                iVar39 = iVar13;
                do {
                  lVar24 = local_cd8;
                  if ((iVar33 + iVar23 + iVar39 & 1U) == 0) {
                    lVar48 = (long)iVar33;
                    lVar37 = (long)iVar39;
                    lVar50 = (lVar48 - local_8c8.begin.y) * local_8c8.jstride;
                    lVar30 = (lVar48 - local_808.begin.y) * local_808.jstride;
                    lVar44 = local_d18.jstride * (iVar33 - local_d18.begin.y);
                    lVar38 = (long)local_d18.begin.x;
                    lVar49 = (iVar33 - local_948.begin.y) * local_948.jstride;
                    lVar52 = (iVar22 - local_948.begin.z) * local_948.kstride;
                    lVar55 = (iVar39 - local_908.begin.z) * local_908.kstride;
                    lVar43 = (iVar19 - local_908.begin.y) * local_908.jstride;
                    lVar65 = (iVar33 - local_888.begin.y) * local_888.jstride;
                    lVar61 = (iVar39 - local_848.begin.z) * local_848.kstride;
                    lVar58 = local_d18.kstride * (iVar39 - local_d18.begin.z);
                    lVar35 = local_d18.kstride * 8;
                    lVar66 = (iVar39 - local_d18.begin.z) * lVar35;
                    lVar51 = local_d18.jstride * 8;
                    lVar56 = local_d18.nstride * local_ee0;
                    lVar54 = lVar51 * (iVar33 - local_d18.begin.y);
                    lVar45 = (iVar33 - local_ac0.begin.y) * local_ac0.jstride;
                    lVar62 = (iVar39 - local_a80.begin.z) * local_a80.kstride;
                    lVar60 = local_a40.nstride * local_ee0 +
                             (iVar39 - local_a40.begin.z) * local_a40.kstride * 8 +
                             (iVar33 - local_a40.begin.y) * local_a40.jstride * 8 +
                             (long)local_a40.begin.x * -8 + lVar42;
                    lVar31 = (lVar37 - local_808.begin.z) * local_808.kstride;
                    lVar59 = (lVar37 - local_8c8.begin.z) * local_8c8.kstride;
                    for (lVar57 = 0; lVar34 + lVar57 <= lVar63; lVar57 = lVar57 + 1) {
                      dVar68 = 0.0;
                      dVar69 = 0.0;
                      if ((lVar29 - lVar34 == lVar57) &&
                         (0 < local_808.p[lVar30 + (iVar17 + ~local_808.begin.x) + lVar31])) {
                        dVar69 = local_b00.p
                                 [(lVar48 - local_b00.begin.y) * local_b00.jstride +
                                  (lVar29 - local_b00.begin.x) +
                                  (lVar37 - local_b00.begin.z) * local_b00.kstride +
                                  local_b00.nstride * (long)piVar41];
                      }
                      if ((iVar33 == iVar15) &&
                         (0 < *(int *)((long)local_848.p +
                                      lVar57 * 4 +
                                      local_848.jstride * 4 * (long)(iVar15 + ~local_848.begin.y) +
                                      lVar61 * 4 + (long)local_848.begin.x * -4 + lVar40))) {
                        dVar68 = *(double *)
                                  ((long)local_b40.p +
                                  lVar57 * 8 +
                                  local_b40.nstride * local_ee0 +
                                  (iVar39 - local_b40.begin.z) * local_b40.kstride * 8 +
                                  (iVar15 - local_b40.begin.y) * local_b40.jstride * 8 +
                                  (long)local_b40.begin.x * -8 + lVar42);
                      }
                      dVar78 = 0.0;
                      dVar73 = 0.0;
                      if ((iVar39 == iVar46) &&
                         (0 < *(int *)((long)local_888.p +
                                      lVar57 * 4 +
                                      local_888.kstride * 4 * (long)(iVar46 + ~local_888.begin.z) +
                                      lVar65 * 4 + (long)local_888.begin.x * -4 + lVar40))) {
                        dVar73 = *(double *)
                                  ((long)local_b80.p +
                                  lVar57 * 8 +
                                  local_b80.nstride * local_ee0 +
                                  (iVar46 - local_b80.begin.z) * local_b80.kstride * 8 +
                                  (iVar33 - local_b80.begin.y) * local_b80.jstride * 8 +
                                  (long)local_b80.begin.x * -8 + lVar42);
                      }
                      if ((lVar25 - lVar34 == lVar57) &&
                         (0 < local_8c8.p[lVar50 + (iVar18 - local_8c8.begin.x) + lVar59])) {
                        dVar78 = local_bc0.p
                                 [(lVar48 - local_bc0.begin.y) * local_bc0.jstride +
                                  (lVar25 - local_bc0.begin.x) +
                                  (lVar37 - local_bc0.begin.z) * local_bc0.kstride +
                                  local_bc0.nstride * (long)piVar41];
                      }
                      dVar79 = 0.0;
                      dVar80 = 0.0;
                      if ((iVar33 == iVar53) &&
                         (0 < local_908.p
                              [lVar34 + ((lVar55 + lVar43 + lVar57) - (long)local_908.begin.x)])) {
                        dVar80 = *(double *)
                                  ((long)local_c00.p +
                                  lVar57 * 8 +
                                  local_c00.nstride * local_ee0 +
                                  (iVar39 - local_c00.begin.z) * local_c00.kstride * 8 +
                                  (iVar53 - local_c00.begin.y) * local_c00.jstride * 8 +
                                  (long)local_c00.begin.x * -8 + lVar42);
                      }
                      if ((iVar39 == iVar28) &&
                         (0 < local_948.p
                              [lVar34 + ((lVar49 + lVar52 + lVar57) - (long)local_948.begin.x)])) {
                        dVar79 = *(double *)
                                  ((long)local_c40.p +
                                  lVar57 * 8 +
                                  local_c40.nstride * local_ee0 +
                                  (iVar28 - local_c40.begin.z) * local_c40.kstride * 8 +
                                  (iVar33 - local_c40.begin.y) * local_c40.jstride * 8 +
                                  (long)local_c40.begin.x * -8 + lVar42);
                      }
                      dVar1 = *(double *)
                               ((long)local_a80.p +
                               lVar57 * 8 +
                               (long)(iVar33 - local_a80.begin.y) * local_a80.jstride * 8 +
                               lVar62 * 8 + local_a80.nstride * local_ee0 +
                               (long)local_a80.begin.x * -8 + lVar42);
                      dVar2 = *(double *)
                               ((long)local_a80.p +
                               lVar57 * 8 +
                               local_a80.jstride * 8 * (long)(iVar16 - local_a80.begin.y) +
                               lVar62 * 8 + local_a80.nstride * local_ee0 +
                               (long)local_a80.begin.x * -8 + lVar42);
                      dVar3 = *(double *)
                               ((long)local_ac0.p +
                               lVar57 * 8 +
                               local_ac0.kstride * 8 * (long)(iVar39 - local_ac0.begin.z) +
                               lVar45 * 8 + local_ac0.nstride * local_ee0 +
                               (long)local_ac0.begin.x * -8 + lVar42);
                      dVar4 = *(double *)
                               ((long)local_ac0.p +
                               lVar57 * 8 +
                               (long)((iVar39 + 1) - local_ac0.begin.z) * local_ac0.kstride * 8 +
                               lVar45 * 8 + local_ac0.nstride * local_ee0 +
                               (long)local_ac0.begin.x * -8 + lVar42);
                      dVar76 = *(double *)
                                ((long)local_d18.p +
                                lVar57 * 8 +
                                lVar66 + lVar56 + (~local_d18.begin.y + iVar33) * lVar51 +
                                lVar38 * -8 + lVar42);
                      dVar5 = *(double *)
                               ((long)local_d18.p +
                               lVar57 * 8 +
                               (iVar16 - local_d18.begin.y) * lVar51 + lVar66 + lVar56 + lVar38 * -8
                               + lVar42);
                      dVar75 = *(double *)
                                ((long)local_d18.p +
                                lVar57 * 8 +
                                lVar54 + lVar56 + lVar35 * (~local_d18.begin.z + iVar39) +
                                lVar38 * -8 + lVar42);
                      dVar74 = *(double *)
                                ((long)local_d18.p +
                                lVar57 * 8 +
                                ((iVar39 + 1) - local_d18.begin.z) * lVar35 + lVar54 + lVar56 +
                                lVar38 * -8 + lVar42);
                      dVar77 = (dVar1 * dVar76 + dVar2 * dVar5) * dStack_d60 +
                               (dVar3 * dVar75 + dVar4 * dVar74) * dVar72;
                      if ((iVar33 == iVar15) &&
                         (0 < *(int *)((long)local_848.p +
                                      lVar57 * 4 +
                                      (long)(~local_848.begin.y + iVar15) * local_848.jstride * 4 +
                                      lVar61 * 4 + (long)local_848.begin.x * -4 + lVar40))) {
                        dVar77 = dVar77 - dStack_d60 * dVar1 * dVar76;
                      }
                      dVar76 = *(double *)((long)local_a40.p + lVar57 * 8 + lVar60);
                      dVar6 = *(double *)((long)local_a40.p + lVar57 * 8 + lVar60 + 8);
                      dVar7 = local_988.p
                              [lVar34 + (((iVar33 - local_988.begin.y) * local_988.jstride +
                                         (iVar39 - local_988.begin.z) * local_988.kstride + lVar57)
                                        - (long)local_988.begin.x)];
                      if ((iVar33 == iVar53) &&
                         (0 < local_908.p
                              [lVar34 + ((lVar55 + lVar43 + lVar57) - (long)local_908.begin.x)])) {
                        dVar77 = dVar77 - dStack_d60 * dVar2 * dVar5;
                      }
                      if ((iVar39 == iVar46) &&
                         (0 < *(int *)((long)local_888.p +
                                      lVar57 * 4 +
                                      (long)(~local_888.begin.z + iVar46) * local_888.kstride * 4 +
                                      lVar65 * 4 + (long)local_888.begin.x * -4 + lVar40))) {
                        dVar77 = dVar77 - dVar72 * dVar3 * dVar75;
                      }
                      if ((iVar39 == iVar28) &&
                         (0 < local_948.p
                              [lVar34 + ((lVar49 + lVar52 + lVar57) - (long)local_948.begin.x)])) {
                        dVar77 = dVar77 - dVar72 * dVar4 * dVar74;
                      }
                      a_ls.arr[lVar57] = dVar76 * -local_d68;
                      b_ls.arr[lVar57] =
                           ((dVar3 + dVar4) * dVar72 +
                           (dVar1 + dVar2) * dStack_d60 +
                           dVar7 * local_c90 + (dVar76 + dVar6) * local_d68) -
                           ((dVar3 * dVar73 + dVar4 * dVar79) * dVar72 +
                           (dVar69 * dVar76 + dVar78 * dVar6) * local_d68 +
                           (dVar1 * dVar68 + dVar2 * dVar80) * dStack_d60);
                      c_ls.arr[lVar57] = dVar6 * -local_d68;
                      u_ls.arr[lVar57] = 0.0;
                      dVar77 = dVar77 + *(double *)
                                         ((long)local_a00.p +
                                         lVar57 * 8 +
                                         local_a00.nstride * local_ee0 +
                                         (iVar39 - local_a00.begin.z) * local_a00.kstride * 8 +
                                         (iVar33 - local_a00.begin.y) * local_a00.jstride * 8 +
                                         (long)local_a00.begin.x * -8 + lVar42);
                      r_ls.arr[lVar57] = dVar77;
                      if ((lVar57 == 0) &&
                         (a_ls.arr[0] = 0.0,
                         local_808.p[lVar30 + (~local_808.begin.x + iVar17) + lVar31] < 1)) {
                        dVar77 = dVar77 + dVar76 * local_d68 *
                                          local_d18.p
                                          [lVar44 + (long)(~local_d18.begin.x + iVar11) +
                                                    lVar58 + local_d18.nstride * (long)piVar41];
                        r_ls.arr[0] = dVar77;
                      }
                      if ((lVar63 - lVar34 == lVar57) &&
                         (c_ls.arr[lVar57] = 0.0,
                         local_8c8.p[lVar50 + (iVar18 - local_8c8.begin.x) + lVar59] < 1)) {
                        r_ls.arr[lVar57] =
                             dVar6 * local_d68 *
                             *(double *)
                              ((long)local_d18.p +
                              lVar57 * 8 + lVar56 + (lVar44 + lVar34 + lVar58) * 8 + lVar38 * -8 + 8
                              ) + dVar77;
                      }
                    }
                    local_f30 = b_ls.arr[0];
                    dVar69 = r_ls.arr[0] / b_ls.arr[0];
                    u_ls.arr[0] = dVar69;
                    for (uVar36 = 0; uVar21 = local_9b8, uVar20 != uVar36; uVar36 = uVar36 + 1) {
                      local_f30 = c_ls.arr[uVar36] / local_f30;
                      adStack_128[uVar36] = local_f30;
                      dVar68 = a_ls.arr[uVar36 + 1];
                      local_f30 = b_ls.arr[uVar36 + 1] - local_f30 * dVar68;
                      if ((local_f30 == 0.0) && (!NAN(local_f30))) {
                        Abort_host(">>>TRIDIAG FAILED");
                      }
                      dVar69 = (dVar69 * -dVar68 + r_ls.arr[uVar36 + 1]) / local_f30;
                      u_ls.arr[uVar36 + 1] = dVar69;
                    }
                    for (; 0 < (int)uVar21; uVar21 = uVar21 - 1) {
                      u_ls.arr[uVar21 - 1] =
                           u_ls.arr[uVar21 - 1] - adStack_128[uVar21 - 1] * u_ls.arr[uVar21];
                    }
                    for (lVar30 = 0; lVar60 = lVar24, lVar34 + lVar30 <= lVar63; lVar30 = lVar30 + 1
                        ) {
                      *(double *)
                       ((long)local_d18.p +
                       lVar30 * 8 +
                       local_d18.nstride * local_ee0 +
                       (iVar39 - local_d18.begin.z) * local_d18.kstride * 8 +
                       (iVar33 - local_d18.begin.y) * local_d18.jstride * 8 +
                       (long)local_d18.begin.x * -8 + lVar42) = u_ls.arr[lVar30];
                    }
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar27 + 1);
              }
            }
            local_ee0 = local_ee0 + 8;
          }
        }
      }
    }
    else {
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&a_ls,this_00,&mfi);
      local_cd8 = (long)local_7c4.smallend.vect[0];
      lVar60 = local_cd8 * 8;
      local_d40 = 0;
      for (piVar41 = (int *)0x0; lVar34 = (long)local_7c4.smallend.vect[2],
          iVar15 = (int)local_cc8 + local_7c4.smallend.vect[2] + local_7c4.smallend.vect[0],
          iVar17 = local_7c4.smallend.vect[2] + -1, iVar46 = local_7c4.smallend.vect[2],
          piVar41 != local_cd0; piVar41 = (int *)((long)piVar41 + 1)) {
        while( true ) {
          iVar46 = iVar46 + 1;
          iVar16 = (int)lVar34;
          if (local_7c4.bigend.vect[2] < iVar16) break;
          iVar53 = local_7c4.smallend.vect[1];
          while (iVar28 = iVar53, iVar28 <= local_7c4.bigend.vect[1]) {
            if (local_7c4.bigend.vect[0] < local_7c4.smallend.vect[0]) {
              iVar53 = iVar28 + 1;
            }
            else {
              lVar29 = (long)iVar28;
              lVar24 = (long)iVar16;
              iVar53 = iVar28 + 1;
              lVar42 = local_a40.nstride * local_d40 +
                       (iVar28 - local_a40.begin.y) * local_a40.jstride * 8 +
                       (lVar34 - local_a40.begin.z) * local_a40.kstride * 8 +
                       (long)local_a40.begin.x * -8 + lVar60;
              lVar62 = (lVar34 - local_a80.begin.z) * local_a80.kstride;
              lVar49 = (iVar28 - local_ac0.begin.y) * local_ac0.jstride;
              lVar30 = local_d18.jstride * 8;
              lVar58 = (iVar28 - local_d18.begin.y) * lVar30;
              lVar25 = local_d18.kstride * 8;
              lVar44 = local_d18.nstride * local_d40;
              lVar48 = (lVar34 - local_d18.begin.z) * lVar25 + lVar44;
              lVar40 = (long)local_d18.begin.x;
              lVar63 = lVar48 + lVar58 + lVar40 * -8 + lVar60;
              lVar45 = 0;
              do {
                if ((iVar15 + iVar28 + (int)lVar45 & 1U) == 0) {
                  if (*(int *)((long)(iVar28 - a_ls.arr[4]._4_4_) * (long)a_ls.arr[1] * 4 +
                               (lVar34 - a_ls.arr[5]._0_4_) * (long)a_ls.arr[2] * 4 +
                               (long)a_ls.arr[4]._0_4_ * -4 + (long)a_ls.arr[0] + local_cd8 * 4 +
                              lVar45 * 4) == 0) {
                    *(undefined8 *)((long)local_d18.p + lVar45 * 8 + lVar63) = 0;
                  }
                  else {
                    dVar68 = 0.0;
                    dVar69 = 0.0;
                    if (((long)local_c84.smallend.vect[0] + -local_cd8 == lVar45) &&
                       (0 < local_808.p
                            [(lVar29 - local_808.begin.y) * local_808.jstride +
                             (long)(~local_808.begin.x + local_c84.smallend.vect[0]) +
                             (lVar24 - local_808.begin.z) * local_808.kstride])) {
                      dVar69 = local_b00.p
                               [(lVar29 - local_b00.begin.y) * local_b00.jstride +
                                ((long)local_c84.smallend.vect[0] - (long)local_b00.begin.x) +
                                (lVar24 - local_b00.begin.z) * local_b00.kstride +
                                local_b00.nstride * (long)piVar41];
                    }
                    if ((local_c84.smallend.vect[1] == iVar28) &&
                       (0 < local_848.p
                            [local_cd8 +
                             (((lVar34 - local_848.begin.z) * local_848.kstride +
                              (~local_848.begin.y + local_c84.smallend.vect[1]) * local_848.jstride
                              + lVar45) - (long)local_848.begin.x)])) {
                      dVar68 = *(double *)
                                ((long)local_b40.p +
                                lVar45 * 8 +
                                local_b40.nstride * local_d40 +
                                (local_c84.smallend.vect[1] - local_b40.begin.y) * local_b40.jstride
                                * 8 + (lVar34 - local_b40.begin.z) * local_b40.kstride * 8 +
                                (long)local_b40.begin.x * -8 + lVar60);
                    }
                    dVar78 = 0.0;
                    dVar73 = 0.0;
                    if ((local_c84.smallend.vect[2] == iVar16) &&
                       (0 < local_888.p
                            [local_cd8 +
                             (((iVar28 - local_888.begin.y) * local_888.jstride +
                              (~local_888.begin.z + local_c84.smallend.vect[2]) * local_888.kstride
                              + lVar45) - (long)local_888.begin.x)])) {
                      dVar73 = *(double *)
                                ((long)local_b80.p +
                                lVar45 * 8 +
                                local_b80.nstride * local_d40 +
                                (local_c84.smallend.vect[2] - local_b80.begin.z) * local_b80.kstride
                                * 8 + (iVar28 - local_b80.begin.y) * local_b80.jstride * 8 +
                                (long)local_b80.begin.x * -8 + lVar60);
                    }
                    if (((long)local_c84.bigend.vect[0] + -local_cd8 == lVar45) &&
                       (0 < local_8c8.p
                            [(lVar29 - local_8c8.begin.y) * local_8c8.jstride +
                             (long)((local_c84.bigend.vect[0] - local_8c8.begin.x) + 1) +
                             (lVar24 - local_8c8.begin.z) * local_8c8.kstride])) {
                      dVar78 = local_bc0.p
                               [(lVar29 - local_bc0.begin.y) * local_bc0.jstride +
                                ((long)local_c84.bigend.vect[0] - (long)local_bc0.begin.x) +
                                (lVar24 - local_bc0.begin.z) * local_bc0.kstride +
                                local_bc0.nstride * (long)piVar41];
                    }
                    dVar79 = 0.0;
                    dVar80 = 0.0;
                    if ((local_c84.bigend.vect[1] == iVar28) &&
                       (0 < local_908.p
                            [local_cd8 +
                             (((lVar34 - local_908.begin.z) * local_908.kstride +
                              ((local_c84.bigend.vect[1] - local_908.begin.y) + 1) *
                              local_908.jstride + lVar45) - (long)local_908.begin.x)])) {
                      dVar80 = *(double *)
                                ((long)local_c00.p +
                                lVar45 * 8 +
                                local_c00.nstride * local_d40 +
                                (local_c84.bigend.vect[1] - local_c00.begin.y) * local_c00.jstride *
                                8 + (lVar34 - local_c00.begin.z) * local_c00.kstride * 8 +
                                (long)local_c00.begin.x * -8 + lVar60);
                    }
                    if ((local_c84.bigend.vect[2] == iVar16) &&
                       (0 < local_948.p
                            [local_cd8 +
                             (((iVar28 - local_948.begin.y) * local_948.jstride +
                              ((local_c84.bigend.vect[2] - local_948.begin.z) + 1) *
                              local_948.kstride + lVar45) - (long)local_948.begin.x)])) {
                      dVar79 = *(double *)
                                ((long)local_c40.p +
                                lVar45 * 8 +
                                local_c40.nstride * local_d40 +
                                (local_c84.bigend.vect[2] - local_c40.begin.z) * local_c40.kstride *
                                8 + (iVar28 - local_c40.begin.y) * local_c40.jstride * 8 +
                                (long)local_c40.begin.x * -8 + lVar60);
                    }
                    dVar1 = *(double *)((long)local_a40.p + lVar45 * 8 + lVar42);
                    dVar2 = *(double *)((long)local_a40.p + lVar45 * 8 + lVar42 + 8);
                    dVar3 = *(double *)
                             ((long)local_a80.p +
                             lVar45 * 8 +
                             local_a80.jstride * 8 * (long)(iVar28 - local_a80.begin.y) + lVar62 * 8
                             + local_a80.nstride * local_d40 + (long)local_a80.begin.x * -8 + lVar60
                             );
                    dVar4 = *(double *)
                             ((long)local_a80.p +
                             lVar45 * 8 +
                             (long)(iVar53 - local_a80.begin.y) * local_a80.jstride * 8 + lVar62 * 8
                             + local_a80.nstride * local_d40 + (long)local_a80.begin.x * -8 + lVar60
                             );
                    dVar76 = *(double *)
                              ((long)local_ac0.p +
                              lVar45 * 8 +
                              (lVar34 - local_ac0.begin.z) * local_ac0.kstride * 8 + lVar49 * 8 +
                              local_ac0.nstride * local_d40 + (long)local_ac0.begin.x * -8 + lVar60)
                    ;
                    dVar5 = *(double *)
                             ((long)local_ac0.p +
                             lVar45 * 8 +
                             ((long)iVar46 - (long)local_ac0.begin.z) * local_ac0.kstride * 8 +
                             lVar49 * 8 + local_ac0.nstride * local_d40 +
                             (long)local_ac0.begin.x * -8 + lVar60);
                    dVar74 = (dVar76 + dVar5) * dStack_6e0 +
                             (dVar3 + dVar4) * dStack_d60 +
                             local_988.p
                             [local_cd8 +
                              (((lVar34 - local_988.begin.z) * local_988.kstride +
                               (iVar28 - local_988.begin.y) * local_988.jstride + lVar45) -
                              (long)local_988.begin.x)] * local_c90 + (dVar1 + dVar2) * local_d68;
                    dVar75 = *(double *)((long)local_d18.p + lVar45 * 8 + lVar63);
                    *(double *)((long)local_d18.p + lVar45 * 8 + lVar63) =
                         (1.15 / (dVar74 - ((dVar73 * dVar76 + dVar79 * dVar5) * local_6e8 +
                                           (dVar69 * dVar1 + dVar78 * dVar2) * local_d68 +
                                           (dVar68 * dVar3 + dVar80 * dVar4) * dStack_d60))) *
                         (*(double *)
                           ((long)local_a00.p +
                           lVar45 * 8 +
                           local_a00.nstride * local_d40 +
                           (iVar28 - local_a00.begin.y) * local_a00.jstride * 8 +
                           (lVar34 - local_a00.begin.z) * local_a00.kstride * 8 +
                           (long)local_a00.begin.x * -8 + lVar60) -
                         (dVar74 * dVar75 -
                         ((dVar76 * *(double *)
                                     ((long)local_d18.p +
                                     lVar45 * 8 +
                                     (iVar17 - local_d18.begin.z) * lVar25 + lVar58 + lVar44 +
                                     lVar40 * -8 + lVar60) +
                          dVar5 * *(double *)
                                   ((long)local_d18.p +
                                   lVar45 * 8 +
                                   ((long)iVar46 - (long)local_d18.begin.z) * lVar25 + lVar44 +
                                   lVar58 + lVar40 * -8 + lVar60)) * dVar72 +
                         (dVar1 * local_d18.p
                                  [local_d18.jstride * (iVar28 - local_d18.begin.y) +
                                   (iVar16 - local_d18.begin.z) * local_d18.kstride +
                                   local_d18.nstride * (long)piVar41 +
                                   (long)(((local_7c4.smallend.vect[0] + -1) - local_d18.begin.x) +
                                         (int)lVar45)] +
                         dVar2 * *(double *)((long)local_d18.p + lVar45 * 8 + lVar63 + 8)) *
                         local_d68 +
                         (dVar3 * *(double *)
                                   ((long)local_d18.p +
                                   lVar45 * 8 +
                                   lVar30 * (~local_d18.begin.y + iVar28) + lVar48 + lVar40 * -8 +
                                   lVar60) +
                         dVar4 * *(double *)
                                  ((long)local_d18.p +
                                  lVar45 * 8 +
                                  (iVar53 - local_d18.begin.y) * lVar30 + lVar48 + lVar40 * -8 +
                                  lVar60)) * dStack_d60))) + dVar75;
                  }
                }
                lVar45 = lVar45 + 1;
              } while ((local_7c4.bigend.vect[0] - local_7c4.smallend.vect[0]) + 1 != (int)lVar45);
            }
          }
          iVar17 = iVar17 + 1;
          iVar15 = iVar15 + 1;
          lVar34 = lVar34 + 1;
        }
        local_d40 = local_d40 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLABecLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs, int redblack) const
{
    BL_PROFILE("MLABecLaplacian::Fsmooth()");

    bool regular_coarsening = true;
    if (amrlev == 0 && mglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
    }

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_ALWAYS_ASSERT(acoef.nGrowVect() == 0);
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const auto& undrrelxr = m_undrrelxr[amrlev][mglev];
    const auto& maskvals  = m_maskvals [amrlev][mglev];

    OrientationIter oitr;

    const FabSet& f0 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f1 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 1)
    const FabSet& f2 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f3 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 2)
    const FabSet& f4 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f5 = undrrelxr[oitr()]; ++oitr;
#endif
#endif

    const MultiMask& mm0 = maskvals[0];
    const MultiMask& mm1 = maskvals[1];
#if (AMREX_SPACEDIM > 1)
    const MultiMask& mm2 = maskvals[2];
    const MultiMask& mm3 = maskvals[3];
#if (AMREX_SPACEDIM > 2)
    const MultiMask& mm4 = maskvals[4];
    const MultiMask& mm5 = maskvals[5];
#endif
#endif

    const int nc = getNComp();
    const Real* h = m_geom[amrlev][mglev].CellSize();
    AMREX_D_TERM(const Real dhx = m_b_scalar/(h[0]*h[0]);,
                 const Real dhy = m_b_scalar/(h[1]*h[1]);,
                 const Real dhz = m_b_scalar/(h[2]*h[2]));
    const Real alpha = m_a_scalar;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && sol.isFusingCandidate()
        && (m_overset_mask[amrlev][mglev] || regular_coarsening))
    {
        const auto& m0ma = mm0.const_arrays();
        const auto& m1ma = mm1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& m2ma = mm2.const_arrays();
        const auto& m3ma = mm3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& m4ma = mm4.const_arrays();
        const auto& m5ma = mm5.const_arrays();
#endif
#endif

        const auto& solnma = sol.arrays();
        const auto& rhsma = rhs.const_arrays();
        const auto& ama = acoef.const_arrays();

        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););

        const auto& f0ma = f0.const_arrays();
        const auto& f1ma = f1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& f2ma = f2.const_arrays();
        const auto& f3ma = f3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& f4ma = f4.const_arrays();
        const auto& f5ma = f5.const_arrays();
#endif
#endif

        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb_os(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                             AMREX_D_DECL(dhx, dhy, dhz),
                             AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                             AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                             AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                             AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                             AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                             osmma[box_no], vbx, redblack);
            });
        } else if (regular_coarsening) {
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                          AMREX_D_DECL(dhx, dhy, dhz),
                          AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                          AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                          AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                          AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                          AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                          vbx, redblack);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sol,mfi_info); mfi.isValid(); ++mfi)
        {
            const auto& m0 = mm0.array(mfi);
            const auto& m1 = mm1.array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& m2 = mm2.array(mfi);
            const auto& m3 = mm3.array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& m4 = mm4.array(mfi);
            const auto& m5 = mm5.array(mfi);
#endif
#endif

            const Box& tbx = mfi.tilebox();
            const Box& vbx = mfi.validbox();
            const auto& solnfab = sol.array(mfi);
            const auto& rhsfab  = rhs.const_array(mfi);
            const auto& afab    = acoef.const_array(mfi);

            AMREX_D_TERM(const auto& bxfab = bxcoef.const_array(mfi);,
                         const auto& byfab = bycoef.const_array(mfi);,
                         const auto& bzfab = bzcoef.const_array(mfi););

            const auto& f0fab = f0.const_array(mfi);
            const auto& f1fab = f1.const_array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& f2fab = f2.const_array(mfi);
            const auto& f3fab = f3.const_array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& f4fab = f4.const_array(mfi);
            const auto& f5fab = f5.const_array(mfi);
#endif
#endif

            if (m_overset_mask[amrlev][mglev]) {
                const auto& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb_os(i,j,k,n, solnfab, rhsfab, alpha, afab,
                                 AMREX_D_DECL(dhx, dhy, dhz),
                                 AMREX_D_DECL(bxfab, byfab, bzfab),
                                 AMREX_D_DECL(m0,m2,m4),
                                 AMREX_D_DECL(m1,m3,m5),
                                 AMREX_D_DECL(f0fab,f2fab,f4fab),
                                 AMREX_D_DECL(f1fab,f3fab,f5fab),
                                 osm, vbx, redblack);
                });
            } else if (regular_coarsening) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb(i,j,k,n, solnfab, rhsfab, alpha, afab,
                              AMREX_D_DECL(dhx, dhy, dhz),
                              AMREX_D_DECL(bxfab, byfab, bzfab),
                              AMREX_D_DECL(m0,m2,m4),
                              AMREX_D_DECL(m1,m3,m5),
                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                              vbx, redblack);
                });
            } else {
                Gpu::LaunchSafeGuard lsg(false); // xxxxx gpu todo
                // line solve does not with with GPU
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( tbx, thread_box,
                {
                    abec_gsrb_with_line_solve(thread_box, solnfab, rhsfab, alpha, afab,
                                              AMREX_D_DECL(dhx, dhy, dhz),
                                              AMREX_D_DECL(bxfab, byfab, bzfab),
                                              AMREX_D_DECL(m0,m2,m4),
                                              AMREX_D_DECL(m1,m3,m5),
                                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                                              vbx, redblack, nc);
                });
            }
        }
    }
}